

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3GetUInt32(char *z,u32 *pI)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  u32 uVar5;
  byte *pbVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(byte)*z;
  uVar1 = uVar7 - 0x30;
  uVar5 = 0;
  uVar3 = 0;
  if (uVar1 < 10) {
    pbVar6 = (byte *)(z + 1);
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar4 = ((long)(char)uVar7 + uVar4 * 10) - 0x30;
      if (0x100000000 < uVar4) {
        uVar3 = 0;
        goto LAB_0016a86f;
      }
      bVar2 = *pbVar6;
      uVar7 = (ulong)bVar2;
      pbVar6 = pbVar6 + 1;
    } while (0xfffffffffffffff5 < uVar7 - 0x3a);
    uVar5 = 0;
    if (bVar2 == 0 && uVar1 < 10) {
      uVar5 = (u32)uVar4;
    }
    uVar3 = (uint)(bVar2 == 0 && uVar1 < 10);
  }
LAB_0016a86f:
  *pI = uVar5;
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetUInt32(const char *z, u32 *pI){
  u64 v = 0;
  int i;
  for(i=0; sqlite3Isdigit(z[i]); i++){
    v = v*10 + z[i] - '0';
    if( v>4294967296LL ){ *pI = 0; return 0; }
  }
  if( i==0 || z[i]!=0 ){ *pI = 0; return 0; }
  *pI = (u32)v;
  return 1;
}